

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindDecimalSum
          (duckdb *this,ClientContext *context,AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  uint8_t scale;
  reference this_00;
  pointer pEVar1;
  reference this_01;
  LogicalType decimal_type;
  AggregateFunction local_148;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::get<true>(arguments,0);
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_00);
  LogicalType::LogicalType(&decimal_type,&pEVar1->return_type);
  GetSumAggregate(&local_148,decimal_type.physical_type_);
  AggregateFunction::operator=(function,&local_148);
  AggregateFunction::~AggregateFunction(&local_148);
  ::std::__cxx11::string::assign
            ((char *)&(function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name)
  ;
  this_01 = vector<duckdb::LogicalType,_true>::get<true>
                      (&(function->super_BaseScalarFunction).super_SimpleFunction.arguments,0);
  LogicalType::operator=(this_01,&decimal_type);
  scale = DecimalType::GetScale(&decimal_type);
  LogicalType::DECIMAL((LogicalType *)&local_148,'&',scale);
  LogicalType::operator=
            (&(function->super_BaseScalarFunction).return_type,(LogicalType *)&local_148);
  LogicalType::~LogicalType((LogicalType *)&local_148);
  function->order_dependent = NOT_ORDER_DEPENDENT;
  *(undefined8 *)this = 0;
  LogicalType::~LogicalType(&decimal_type);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> BindDecimalSum(ClientContext &context, AggregateFunction &function,
                                        vector<unique_ptr<Expression>> &arguments) {
	auto decimal_type = arguments[0]->return_type;
	function = GetSumAggregate(decimal_type.InternalType());
	function.name = "sum";
	function.arguments[0] = decimal_type;
	function.return_type = LogicalType::DECIMAL(Decimal::MAX_WIDTH_DECIMAL, DecimalType::GetScale(decimal_type));
	function.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
	return nullptr;
}